

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RichTextTests.cpp
# Opt level: O0

void __thiscall agge::tests::RichTextTests::StyleAtributesCanBeResetToBase(RichTextTests *this)

{
  byte bVar1;
  annotated_string<char,_agge::font_style_annotation> *paVar2;
  font_style_annotation *pfVar3;
  allocator local_a11;
  string local_a10;
  LocationInfo local_9f0;
  font_hinting local_9c8 [2];
  style_modifier local_9c0;
  allocator local_989;
  string local_988;
  LocationInfo local_968;
  style_modifier local_940;
  allocator local_909;
  string local_908;
  LocationInfo local_8e8;
  font_weight local_8c0 [2];
  style_modifier local_8b8;
  allocator local_881;
  string local_880;
  LocationInfo local_860;
  int local_838 [2];
  style_modifier local_830;
  allocator local_7f9;
  string local_7f8;
  LocationInfo local_7d8;
  style_modifier local_7b0;
  style_modifier local_780;
  style_modifier local_750;
  style_modifier local_720;
  style_modifier local_6f0;
  allocator local_6b9;
  string local_6b8;
  style_modifier local_698;
  style_modifier local_668;
  style_modifier local_638;
  style_modifier local_608;
  style_modifier local_5d8;
  allocator local_5a1;
  string local_5a0;
  undefined1 local_580 [8];
  font_style_annotation a2;
  string local_548;
  LocationInfo local_528;
  font_hinting local_500 [2];
  style_modifier local_4f8;
  allocator local_4c1;
  string local_4c0;
  LocationInfo local_4a0;
  style_modifier local_478;
  allocator local_441;
  string local_440;
  LocationInfo local_420;
  font_weight local_3f8 [2];
  style_modifier local_3f0;
  allocator local_3b9;
  string local_3b8;
  LocationInfo local_398;
  int local_370 [2];
  style_modifier local_368;
  allocator local_331;
  string local_330;
  LocationInfo local_310;
  style_modifier local_2e8;
  style_modifier local_2b8;
  style_modifier local_288;
  style_modifier local_258;
  style_modifier local_228;
  allocator local_1f1;
  string local_1f0;
  style_modifier local_1d0;
  style_modifier local_1a0;
  style_modifier local_170;
  style_modifier local_140;
  style_modifier local_110;
  undefined1 local_e0 [8];
  richtext_t text;
  allocator local_61;
  string local_60;
  undefined1 local_40 [8];
  font_style_annotation a1;
  RichTextTests *this_local;
  
  a1._40_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,"Arial",&local_61);
  font_descriptor::create((font_descriptor *)local_40,&local_60,0xf,regular,true,hint_none);
  a1.basic._32_1_ = 0;
  a1.basic._33_1_ = 0;
  a1.basic._34_1_ = 0;
  a1.basic._35_1_ = 0;
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  annotated_string<char,_agge::font_style_annotation>::annotated_string
            ((annotated_string<char,_agge::font_style_annotation> *)local_e0,
             (font_style_annotation *)local_40);
  paVar2 = operator<<((annotated_string<char,_agge::font_style_annotation> *)local_e0,"foobar");
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1f0,"Tahoma",&local_1f1);
  style::family(&local_1d0,&local_1f0);
  style::height(&local_228,0x14);
  style_modifier::operator+(&local_1a0,&local_1d0,&local_228);
  style::weight(&local_258,bold);
  style_modifier::operator+(&local_170,&local_1a0,&local_258);
  style::italic(&local_288,false);
  style_modifier::operator+(&local_140,&local_170,&local_288);
  style::hinting(&local_2b8,hint_strong);
  style_modifier::operator+(&local_110,&local_140,&local_2b8);
  operator<<(paVar2,&local_110);
  style_modifier::~style_modifier(&local_110);
  style_modifier::~style_modifier(&local_2b8);
  style_modifier::~style_modifier(&local_140);
  style_modifier::~style_modifier(&local_288);
  style_modifier::~style_modifier(&local_170);
  style_modifier::~style_modifier(&local_258);
  style_modifier::~style_modifier(&local_1a0);
  style_modifier::~style_modifier(&local_228);
  style_modifier::~style_modifier(&local_1d0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
  style::family_base();
  operator<<((richtext_t *)local_e0,&local_2e8);
  style_modifier::~style_modifier(&local_2e8);
  pfVar3 = annotated_string<char,_agge::font_style_annotation>::current_annotation
                     ((annotated_string<char,_agge::font_style_annotation> *)local_e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_330,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/RichTextTests.cpp"
             ,&local_331);
  ut::LocationInfo::LocationInfo(&local_310,&local_330,0xca);
  ut::are_equal<char,6ul>
            ((char (*) [6])"Arial",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pfVar3,&local_310)
  ;
  ut::LocationInfo::~LocationInfo(&local_310);
  std::__cxx11::string::~string((string *)&local_330);
  std::allocator<char>::~allocator((allocator<char> *)&local_331);
  style::height_base();
  operator<<((richtext_t *)local_e0,&local_368);
  style_modifier::~style_modifier(&local_368);
  local_370[1] = 0xf;
  pfVar3 = annotated_string<char,_agge::font_style_annotation>::current_annotation
                     ((annotated_string<char,_agge::font_style_annotation> *)local_e0);
  local_370[0] = (*(int *)&(pfVar3->basic).field_0x20 << 0xc) >> 0xc;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_3b8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/RichTextTests.cpp"
             ,&local_3b9);
  ut::LocationInfo::LocationInfo(&local_398,&local_3b8,0xcc);
  ut::are_equal<int,int>(local_370 + 1,local_370,&local_398);
  ut::LocationInfo::~LocationInfo(&local_398);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
  style::weight_base();
  operator<<((richtext_t *)local_e0,&local_3f0);
  style_modifier::~style_modifier(&local_3f0);
  local_3f8[1] = 3;
  pfVar3 = annotated_string<char,_agge::font_style_annotation>::current_annotation
                     ((annotated_string<char,_agge::font_style_annotation> *)local_e0);
  local_3f8[0] = *(uint *)&(pfVar3->basic).field_0x20 >> 0x14 & (extra_black|black);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_440,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/RichTextTests.cpp"
             ,&local_441);
  ut::LocationInfo::LocationInfo(&local_420,&local_440,0xce);
  ut::are_equal<agge::font_weight,agge::font_weight>(local_3f8 + 1,local_3f8,&local_420);
  ut::LocationInfo::~LocationInfo(&local_420);
  std::__cxx11::string::~string((string *)&local_440);
  std::allocator<char>::~allocator((allocator<char> *)&local_441);
  style::italic_base();
  operator<<((richtext_t *)local_e0,&local_478);
  style_modifier::~style_modifier(&local_478);
  pfVar3 = annotated_string<char,_agge::font_style_annotation>::current_annotation
                     ((annotated_string<char,_agge::font_style_annotation> *)local_e0);
  bVar1 = (pfVar3->basic).field_0x23;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_4c0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/RichTextTests.cpp"
             ,&local_4c1);
  ut::LocationInfo::LocationInfo(&local_4a0,&local_4c0,0xd0);
  ut::is_true((bool)(bVar1 & 1),&local_4a0);
  ut::LocationInfo::~LocationInfo(&local_4a0);
  std::__cxx11::string::~string((string *)&local_4c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4c1);
  style::hinting_base();
  operator<<((richtext_t *)local_e0,&local_4f8);
  style_modifier::~style_modifier(&local_4f8);
  local_500[1] = 0;
  pfVar3 = annotated_string<char,_agge::font_style_annotation>::current_annotation
                     ((annotated_string<char,_agge::font_style_annotation> *)local_e0);
  local_500[0] = *(uint *)&(pfVar3->basic).field_0x20 >> 0x19 & (hint_strong|hint_vertical);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_548,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/RichTextTests.cpp"
             ,(allocator *)&a2.field_0x2f);
  ut::LocationInfo::LocationInfo(&local_528,&local_548,0xd2);
  ut::are_equal<agge::font_hinting,agge::font_hinting>(local_500 + 1,local_500,&local_528);
  ut::LocationInfo::~LocationInfo(&local_528);
  std::__cxx11::string::~string((string *)&local_548);
  std::allocator<char>::~allocator((allocator<char> *)&a2.field_0x2f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5a0,"Segoe",&local_5a1);
  font_descriptor::create((font_descriptor *)local_580,&local_5a0,0x10,light,false,hint_vertical);
  a2.basic._32_1_ = 0;
  a2.basic._33_1_ = 0;
  a2.basic._34_1_ = 0;
  a2.basic._35_1_ = 0;
  std::__cxx11::string::~string((string *)&local_5a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5a1);
  annotated_string<char,_agge::font_style_annotation>::set_base_annotation
            ((annotated_string<char,_agge::font_style_annotation> *)local_e0,
             (font_style_annotation *)local_580);
  paVar2 = operator<<((annotated_string<char,_agge::font_style_annotation> *)local_e0,"foobar");
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_6b8,"Tahoma",&local_6b9);
  style::family(&local_698,&local_6b8);
  style::height(&local_6f0,0x14);
  style_modifier::operator+(&local_668,&local_698,&local_6f0);
  style::weight(&local_720,bold);
  style_modifier::operator+(&local_638,&local_668,&local_720);
  style::italic(&local_750,true);
  style_modifier::operator+(&local_608,&local_638,&local_750);
  style::hinting(&local_780,hint_strong);
  style_modifier::operator+(&local_5d8,&local_608,&local_780);
  operator<<(paVar2,&local_5d8);
  style_modifier::~style_modifier(&local_5d8);
  style_modifier::~style_modifier(&local_780);
  style_modifier::~style_modifier(&local_608);
  style_modifier::~style_modifier(&local_750);
  style_modifier::~style_modifier(&local_638);
  style_modifier::~style_modifier(&local_720);
  style_modifier::~style_modifier(&local_668);
  style_modifier::~style_modifier(&local_6f0);
  style_modifier::~style_modifier(&local_698);
  std::__cxx11::string::~string((string *)&local_6b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6b9);
  style::family_base();
  operator<<((richtext_t *)local_e0,&local_7b0);
  style_modifier::~style_modifier(&local_7b0);
  pfVar3 = annotated_string<char,_agge::font_style_annotation>::current_annotation
                     ((annotated_string<char,_agge::font_style_annotation> *)local_e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_7f8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/RichTextTests.cpp"
             ,&local_7f9);
  ut::LocationInfo::LocationInfo(&local_7d8,&local_7f8,0xdd);
  ut::are_equal<char,6ul>
            ((char (*) [6])"Segoe",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pfVar3,&local_7d8)
  ;
  ut::LocationInfo::~LocationInfo(&local_7d8);
  std::__cxx11::string::~string((string *)&local_7f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_7f9);
  style::height_base();
  operator<<((richtext_t *)local_e0,&local_830);
  style_modifier::~style_modifier(&local_830);
  local_838[1] = 0x10;
  pfVar3 = annotated_string<char,_agge::font_style_annotation>::current_annotation
                     ((annotated_string<char,_agge::font_style_annotation> *)local_e0);
  local_838[0] = (*(int *)&(pfVar3->basic).field_0x20 << 0xc) >> 0xc;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_880,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/RichTextTests.cpp"
             ,&local_881);
  ut::LocationInfo::LocationInfo(&local_860,&local_880,0xdf);
  ut::are_equal<int,int>(local_838 + 1,local_838,&local_860);
  ut::LocationInfo::~LocationInfo(&local_860);
  std::__cxx11::string::~string((string *)&local_880);
  std::allocator<char>::~allocator((allocator<char> *)&local_881);
  style::weight_base();
  operator<<((richtext_t *)local_e0,&local_8b8);
  style_modifier::~style_modifier(&local_8b8);
  local_8c0[1] = 1;
  pfVar3 = annotated_string<char,_agge::font_style_annotation>::current_annotation
                     ((annotated_string<char,_agge::font_style_annotation> *)local_e0);
  local_8c0[0] = *(uint *)&(pfVar3->basic).field_0x20 >> 0x14 & (extra_black|black);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_908,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/RichTextTests.cpp"
             ,&local_909);
  ut::LocationInfo::LocationInfo(&local_8e8,&local_908,0xe1);
  ut::are_equal<agge::font_weight,agge::font_weight>(local_8c0 + 1,local_8c0,&local_8e8);
  ut::LocationInfo::~LocationInfo(&local_8e8);
  std::__cxx11::string::~string((string *)&local_908);
  std::allocator<char>::~allocator((allocator<char> *)&local_909);
  style::italic_base();
  operator<<((richtext_t *)local_e0,&local_940);
  style_modifier::~style_modifier(&local_940);
  pfVar3 = annotated_string<char,_agge::font_style_annotation>::current_annotation
                     ((annotated_string<char,_agge::font_style_annotation> *)local_e0);
  bVar1 = (pfVar3->basic).field_0x23;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_988,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/RichTextTests.cpp"
             ,&local_989);
  ut::LocationInfo::LocationInfo(&local_968,&local_988,0xe3);
  ut::is_false((bool)(bVar1 & 1),&local_968);
  ut::LocationInfo::~LocationInfo(&local_968);
  std::__cxx11::string::~string((string *)&local_988);
  std::allocator<char>::~allocator((allocator<char> *)&local_989);
  style::hinting_base();
  operator<<((richtext_t *)local_e0,&local_9c0);
  style_modifier::~style_modifier(&local_9c0);
  local_9c8[1] = 1;
  pfVar3 = annotated_string<char,_agge::font_style_annotation>::current_annotation
                     ((annotated_string<char,_agge::font_style_annotation> *)local_e0);
  local_9c8[0] = *(uint *)&(pfVar3->basic).field_0x20 >> 0x19 & (hint_strong|hint_vertical);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_a10,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/RichTextTests.cpp"
             ,&local_a11);
  ut::LocationInfo::LocationInfo(&local_9f0,&local_a10,0xe5);
  ut::are_equal<agge::font_hinting,agge::font_hinting>(local_9c8 + 1,local_9c8,&local_9f0);
  ut::LocationInfo::~LocationInfo(&local_9f0);
  std::__cxx11::string::~string((string *)&local_a10);
  std::allocator<char>::~allocator((allocator<char> *)&local_a11);
  font_style_annotation::~font_style_annotation((font_style_annotation *)local_580);
  annotated_string<char,_agge::font_style_annotation>::~annotated_string
            ((annotated_string<char,_agge::font_style_annotation> *)local_e0);
  font_style_annotation::~font_style_annotation((font_style_annotation *)local_40);
  return;
}

Assistant:

test( StyleAtributesCanBeResetToBase )
			{
				// INIT
				font_style_annotation a1 = {	font_descriptor::create("Arial", 15, regular, true, hint_none),	};
				richtext_t text(a1);

				text << "foobar" << style::family("Tahoma") + style::height(20) + style::weight(bold) + style::italic(false)
					+ style::hinting(hint_strong);

				// ACT / ASSERT
				text << style::family_base();
				assert_equal("Arial", text.current_annotation().basic.family);
				text << style::height_base();
				assert_equal(15, text.current_annotation().basic.height);
				text << style::weight_base();
				assert_equal(regular, text.current_annotation().basic.weight);
				text << style::italic_base();
				assert_is_true(text.current_annotation().basic.italic);
				text << style::hinting_base();
				assert_equal(hint_none, text.current_annotation().basic.hinting);

				// INIT
				font_style_annotation a2 = {	font_descriptor::create("Segoe", 16, light, false, hint_vertical),	};

				text.set_base_annotation(a2);
				text << "foobar" << style::family("Tahoma") + style::height(20) + style::weight(bold) + style::italic(true)
					+ style::hinting(hint_strong);

				// ACT / ASSERT
				text << style::family_base();
				assert_equal("Segoe", text.current_annotation().basic.family);
				text << style::height_base();
				assert_equal(16, text.current_annotation().basic.height);
				text << style::weight_base();
				assert_equal(light, text.current_annotation().basic.weight);
				text << style::italic_base();
				assert_is_false(text.current_annotation().basic.italic);
				text << style::hinting_base();
				assert_equal(hint_vertical, text.current_annotation().basic.hinting);
			}